

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void Adam7_getpassvalues(uint *passw,uint *passh,size_t *filter_passstart,size_t *padded_passstart,
                        size_t *passstart,uint w,uint h,uint bpp)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    *(uint *)((long)passw + lVar5) =
         (~*(uint *)((long)ADAM7_IX + lVar5) + *(uint *)((long)ADAM7_DX + lVar5) + w) /
         *(uint *)((long)ADAM7_DX + lVar5);
    uVar2 = (~*(uint *)((long)ADAM7_IY + lVar5) + *(uint *)((long)ADAM7_DY + lVar5) + h) /
            *(uint *)((long)ADAM7_DY + lVar5);
    *(uint *)((long)passh + lVar5) = uVar2;
    if (*(int *)((long)passw + lVar5) == 0) {
      uVar2 = 0;
    }
    *(uint *)((long)passh + lVar5) = uVar2;
    if (uVar2 == 0) {
      *(undefined4 *)((long)passw + lVar5) = 0;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x1c);
  lVar5 = 0;
  *passstart = 0;
  *padded_passstart = 0;
  *filter_passstart = 0;
  do {
    iVar1 = *(int *)((long)passw + lVar5);
    iVar4 = *(int *)((long)passh + lVar5);
    if (iVar1 == 0) {
LAB_00111c41:
      uVar3 = 0;
    }
    else {
      if (iVar4 == 0) {
        iVar4 = 0;
        goto LAB_00111c41;
      }
      uVar3 = (ulong)(((iVar1 * bpp + 7 >> 3) + 1) * iVar4);
    }
    *(ulong *)((long)filter_passstart + lVar5 * 2 + 8) =
         uVar3 + *(long *)((long)filter_passstart + lVar5 * 2);
    *(ulong *)((long)padded_passstart + lVar5 * 2 + 8) =
         (ulong)((iVar1 * bpp + 7 >> 3) * iVar4) + *(long *)((long)padded_passstart + lVar5 * 2);
    *(ulong *)((long)passstart + lVar5 * 2 + 8) =
         (ulong)(iVar1 * bpp * iVar4 + 7 >> 3) + *(long *)((long)passstart + lVar5 * 2);
    lVar5 = lVar5 + 4;
    if (lVar5 == 0x1c) {
      return;
    }
  } while( true );
}

Assistant:

static void Adam7_getpassvalues(unsigned passw[7], unsigned passh[7], size_t filter_passstart[8],
                                size_t padded_passstart[8], size_t passstart[8], unsigned w, unsigned h, unsigned bpp)
{
  /*the passstart values have 8 values: the 8th one indicates the byte after the end of the 7th (= last) pass*/
  unsigned i;

  /*calculate width and height in pixels of each pass*/
  for(i = 0; i != 7; ++i)
  {
    passw[i] = (w + ADAM7_DX[i] - ADAM7_IX[i] - 1) / ADAM7_DX[i];
    passh[i] = (h + ADAM7_DY[i] - ADAM7_IY[i] - 1) / ADAM7_DY[i];
    if(passw[i] == 0) passh[i] = 0;
    if(passh[i] == 0) passw[i] = 0;
  }

  filter_passstart[0] = padded_passstart[0] = passstart[0] = 0;
  for(i = 0; i != 7; ++i)
  {
    /*if passw[i] is 0, it's 0 bytes, not 1 (no filtertype-byte)*/
    filter_passstart[i + 1] = filter_passstart[i]
                            + ((passw[i] && passh[i]) ? passh[i] * (1 + (passw[i] * bpp + 7) / 8) : 0);
    /*bits padded if needed to fill full byte at end of each scanline*/
    padded_passstart[i + 1] = padded_passstart[i] + passh[i] * ((passw[i] * bpp + 7) / 8);
    /*only padded at end of reduced image*/
    passstart[i + 1] = passstart[i] + (passh[i] * passw[i] * bpp + 7) / 8;
  }
}